

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

vm_tadsobj_hdr *
vm_tadsobj_hdr::expand_to
          (CVmObjTads *self,vm_tadsobj_hdr *hdr,size_t new_sc_cnt,size_t new_prop_cnt)

{
  vm_tadsobj_prop *pvVar1;
  undefined8 *puVar2;
  uchar uVar3;
  ushort uVar4;
  ushort uVar5;
  vm_tadsobj_prop *pvVar6;
  anon_union_8_8_cb74652f_for_val aVar7;
  vm_tadsobj_hdr *pvVar8;
  uint uVar9;
  long lVar10;
  tadsobj_objid_and_ptr *__ptr;
  ulong uVar11;
  
  pvVar8 = alloc(self,(unsigned_short)new_sc_cnt,(unsigned_short)new_prop_cnt);
  uVar9 = (uint)hdr->sc_cnt;
  if (new_sc_cnt <= hdr->sc_cnt) {
    uVar9 = (uint)new_sc_cnt;
  }
  memcpy(pvVar8->sc,hdr->sc,(ulong)(uVar9 << 4));
  pvVar8->li_obj_flags = hdr->li_obj_flags;
  pvVar8->intern_obj_flags = hdr->intern_obj_flags;
  __ptr = hdr->inh_path;
  if (hdr->sc_cnt != new_sc_cnt) {
    if (__ptr != (tadsobj_objid_and_ptr *)0x0) {
      free(__ptr);
      hdr->inh_path = (tadsobj_objid_and_ptr *)0x0;
    }
    __ptr = (tadsobj_objid_and_ptr *)0x0;
  }
  pvVar8->inh_path = __ptr;
  uVar4 = hdr->prop_entry_free;
  if (uVar4 != 0) {
    pvVar6 = hdr->prop_entry_arr;
    lVar10 = 0;
    do {
      uVar5 = *(ushort *)((long)&pvVar6->prop + lVar10);
      uVar3 = (&pvVar6->flags)[lVar10];
      pvVar1 = pvVar8->prop_entry_arr + pvVar8->prop_entry_free;
      uVar11 = (ulong)((*(int *)&pvVar8->hash_siz - 1U & (uint)uVar5) << 3);
      pvVar1->nxt = *(vm_tadsobj_prop **)((long)pvVar8->hash_arr + uVar11);
      *(vm_tadsobj_prop **)((long)pvVar8->hash_arr + uVar11) = pvVar1;
      pvVar8->prop_entry_free = pvVar8->prop_entry_free + 1;
      pvVar1->prop = uVar5;
      puVar2 = (undefined8 *)((long)&(pvVar6->val).typ + lVar10);
      aVar7 = *(anon_union_8_8_cb74652f_for_val *)(puVar2 + 1);
      *(undefined8 *)&pvVar1->val = *puVar2;
      (pvVar1->val).val = aVar7;
      pvVar1->flags = uVar3;
      lVar10 = lVar10 + 0x28;
    } while ((ulong)uVar4 * 0x28 != lVar10);
  }
  (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,hdr);
  return pvVar8;
}

Assistant:

vm_tadsobj_hdr *vm_tadsobj_hdr::expand_to(VMG_ CVmObjTads *self,
                                          vm_tadsobj_hdr *hdr,
                                          size_t new_sc_cnt,
                                          size_t new_prop_cnt)
{
    vm_tadsobj_hdr *new_hdr;
    size_t i;
    vm_tadsobj_prop *entryp;

    /* allocate a new object at the expanded property table size */
    new_hdr = alloc(vmg_ self, (ushort)new_sc_cnt, (ushort)new_prop_cnt);

    /* copy the superclasses from the original object */
    memcpy(new_hdr->sc, hdr->sc,
           (hdr->sc_cnt < new_sc_cnt ? hdr->sc_cnt : new_sc_cnt)
           * sizeof(hdr->sc[0]));

    /* use the same flags from the original object */
    new_hdr->li_obj_flags = hdr->li_obj_flags;
    new_hdr->intern_obj_flags = hdr->intern_obj_flags;

    /* 
     *   if the superclass count is changing, we're obviously changing the
     *   inheritance structure, in which case the old cached inheritance path
     *   is invalid - delete it if so 
     */
    if (new_sc_cnt != hdr->sc_cnt)
        hdr->inval_inh_path();

    /* copy the old inheritance path (if we still have one) */
    new_hdr->inh_path = hdr->inh_path;

    /* 
     *   Run through all of the existing properties and duplicate them in the
     *   new object, to build the new object's hash table.  Note that the
     *   free index is inherently equivalent to the count of properties in
     *   use.  
     */
    for (i = hdr->prop_entry_free, entryp = hdr->prop_entry_arr ; i != 0 ;
         --i, ++entryp)
    {
        /* add this property to the new table */
        new_hdr->alloc_prop_entry(entryp->prop, &entryp->val, entryp->flags);
    }

    /* delete the old header */
    G_mem->get_var_heap()->free_mem(hdr);
    
    /* return the new header */
    return new_hdr;
}